

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

void advance_level(CHAR_DATA *ch,bool hide)

{
  short sVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  CClass *pCVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  byte in_SIL;
  long in_RDI;
  int wis_mod;
  int i;
  int sn;
  int int_mod;
  int add_prac;
  int add_move;
  int add_mana;
  int add_hp;
  float tmp;
  char buf [4608];
  CHAR_DATA *in_stack_000035a8;
  undefined4 in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  int in_stack_ffffffffffffed20;
  undefined4 in_stack_ffffffffffffed24;
  undefined4 in_stack_ffffffffffffed28;
  undefined4 in_stack_ffffffffffffed2c;
  undefined4 in_stack_ffffffffffffed30;
  undefined4 in_stack_ffffffffffffed34;
  undefined4 in_stack_ffffffffffffed38;
  undefined4 in_stack_ffffffffffffed3c;
  undefined8 in_stack_ffffffffffffed48;
  char *__s;
  CHAR_DATA *in_stack_ffffffffffffed50;
  int local_1258;
  int local_1254 [3];
  int local_1248;
  int local_1244;
  int local_1240;
  int local_123c;
  int local_1238;
  uint local_1234;
  uint local_1230;
  float local_122c;
  char local_1228 [4432];
  char *in_stack_ffffffffffffff28;
  CHAR_DATA *in_stack_ffffffffffffff30;
  
  iVar10 = (int)((ulong)in_stack_ffffffffffffed48 >> 0x20);
  bVar6 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
  if (!bVar6) {
    *(int *)(*(long *)(in_RDI + 0xc0) + 0x3d4) =
         (*(int *)(in_RDI + 0x13c) + ((int)current_time - (int)*(undefined8 *)(in_RDI + 0x148))) /
         0xe10;
    pCVar11 = char_data::Class((char_data *)
                               CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30));
    iVar7 = CClass::GetIndex(pCVar11);
    sprintf(local_1228,"the %s",
            title_table[iVar7][*(short *)(in_RDI + 0x138)]
            [(int)(uint)(*(short *)(in_RDI + 0x134) == 2)]);
    set_title(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_1240 = get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    local_1240 = local_1240 + -2;
    local_1254[2] = get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    local_1254[2] = local_1254[2] + -2;
    get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    local_1238 = number_range(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    iVar7 = get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    local_123c = (int)wis_app[iVar7].practice;
    iVar8 = get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    pCVar11 = char_data::Class((char_data *)
                               CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30));
    iVar7 = pCVar11->gainconst;
    iVar9 = number_range(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    local_122c = (float)iVar7 * 1.3333 + (float)iVar8 * 0.5333 + -1.3333 + (float)iVar9;
    local_1230 = (uint)local_122c;
    iVar7 = get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    if (0x17 < iVar7) {
      iVar7 = get_curr_stat(in_stack_ffffffffffffed50,iVar10);
      local_1230 = iVar7 + -0x17 + local_1230;
    }
    iVar7 = get_curr_stat(in_stack_ffffffffffffed50,iVar10);
    pCVar11 = char_data::Class((char_data *)
                               CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30));
    iVar10 = pCVar11->gainconst;
    iVar8 = number_range(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    local_122c = (float)iVar10 * -2.0833 + (float)iVar7 * 0.5667 + 8.0278 + (float)iVar8;
    local_1234 = (uint)local_122c;
    pCVar11 = char_data::Class((char_data *)
                               CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30));
    iVar10 = CClass::GetIndex(pCVar11);
    if ((iVar10 == 1) && (iVar10 = number_percent(), 0x4b < iVar10)) {
      local_1230 = local_1230 + 1;
    }
    pCVar11 = char_data::Class((char_data *)
                               CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30));
    iVar10 = CClass::GetIndex(pCVar11);
    if (iVar10 == 10) {
      iVar10 = number_range(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      local_1234 = local_1234 - iVar10;
    }
    pCVar11 = char_data::Class((char_data *)
                               CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30));
    iVar10 = CClass::GetIndex(pCVar11);
    if (iVar10 == 0xb) {
      iVar10 = number_range(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
      local_1234 = local_1234 - iVar10;
    }
    local_1254[1] = 6;
    piVar12 = std::max<int>(local_1254 + 1,&local_1238);
    local_1238 = *piVar12;
    *(short *)(in_RDI + 0x15c) = *(short *)(in_RDI + 0x15c) + (short)local_1230;
    *(short *)(in_RDI + 0x160) = *(short *)(in_RDI + 0x160) + (short)local_1234;
    *(short *)(in_RDI + 0x164) = *(short *)(in_RDI + 0x164) + (short)local_1238;
    *(short *)(in_RDI + 0x1fa) = *(short *)(in_RDI + 0x1fa) + (short)local_123c;
    if ((int)*(short *)(in_RDI + 0x138) % 5 == 0) {
      *(short *)(in_RDI + 0x1fc) = *(short *)(in_RDI + 0x1fc) + 1;
    }
    pCVar11 = char_data::Class((char_data *)
                               CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30));
    iVar10 = CClass::GetIndex(pCVar11);
    if ((iVar10 == 1) && ((int)*(short *)(in_RDI + 0x138) % 0x14 == 0)) {
      *(short *)(*(long *)(in_RDI + 0xc0) + 0x86) = *(short *)(*(long *)(in_RDI + 0xc0) + 0x86) + 1;
    }
    *(short *)(*(long *)(in_RDI + 0xc0) + 0x70) =
         *(short *)(*(long *)(in_RDI + 0xc0) + 0x70) + (short)local_1230;
    *(short *)(*(long *)(in_RDI + 0xc0) + 0x72) =
         *(short *)(*(long *)(in_RDI + 0xc0) + 0x72) + (short)local_1234;
    *(short *)(*(long *)(in_RDI + 0xc0) + 0x74) =
         *(short *)(*(long *)(in_RDI + 0xc0) + 0x74) + (short)local_1238;
    for (local_1244 = 0; local_1244 < 800; local_1244 = local_1244 + 1) {
      if ((10 < *(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)local_1244 * 2)) &&
         (skill_table[local_1244].ctype != 3)) {
        *(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)local_1244 * 2) =
             *(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)local_1244 * 2) + 1;
        local_1254[0] = (int)*(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)local_1244 * 2);
        local_1258 = 100;
        piVar12 = std::min<int>(local_1254,&local_1258);
        *(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)local_1244 * 2) = (short)*piVar12;
      }
    }
    for (local_1248 = 0; local_1248 < 100; local_1248 = local_1248 + 1) {
      if (((*(long *)(*(long *)(in_RDI + 0xc0) + 0xb0 + (long)local_1248 * 8) != 0) &&
          (**(char **)(*(long *)(in_RDI + 0xc0) + 0xb0 + (long)local_1248 * 8) != '\0')) &&
         (iVar10 = strcmp(*(char **)(*(long *)(in_RDI + 0xc0) + 0xb0 + (long)local_1248 * 8),""),
         iVar10 != 0)) {
        free_pstring((char *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20));
        *(undefined8 *)(*(long *)(in_RDI + 0xc0) + 0xb0 + (long)local_1248 * 8) = 0;
      }
    }
    if ((in_SIL & 1) == 0) {
      __s = local_1228;
      pcVar13 = get_char_color((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),
                               (char *)CONCAT44(in_stack_ffffffffffffed34,in_stack_ffffffffffffed30)
                              );
      uVar5 = local_1230;
      uVar4 = local_1234;
      iVar7 = local_1238;
      iVar10 = local_123c;
      sVar1 = *(short *)(in_RDI + 0x15c);
      sVar2 = *(short *)(in_RDI + 0x160);
      iVar8 = (int)*(short *)(in_RDI + 0x164);
      sVar3 = *(short *)(in_RDI + 0x1fa);
      pcVar14 = END_COLOR((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28)
                         );
      sprintf(__s,"%sYou gain %d/%d hp, %d/%d mana, %d/%d move, and %d/%d practices.%s\n\r",pcVar13,
              (ulong)uVar5,(ulong)(uint)(int)sVar1,(ulong)uVar4,(int)sVar2,iVar7,iVar8,iVar10,
              (int)sVar3,pcVar14);
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffed34,iVar10),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,iVar8));
    }
    save_char_obj(in_stack_000035a8);
  }
  return;
}

Assistant:

void advance_level(CHAR_DATA *ch, bool hide)
{
	char buf[MAX_STRING_LENGTH];
	float tmp;
	int add_hp;
	int add_mana;
	int add_move;
	int add_prac;
	int int_mod;
	int sn;
	int i;
	int wis_mod;

	if (is_npc(ch))
		return;

	ch->pcdata->last_level = (ch->played + (int)(current_time - ch->logon)) / 3600;

	sprintf(buf, "the %s", title_table[ch->Class()->GetIndex()][ch->level][ch->sex == SEX_FEMALE ? 1 : 0]);
	set_title(ch, buf);

	int_mod = get_curr_stat(ch, STAT_INT) - 2;
	wis_mod = get_curr_stat(ch, STAT_WIS) - 2;
	add_move = number_range(
		(get_curr_stat(ch, STAT_CON) + get_curr_stat(ch, STAT_DEX)) / 5,
		(get_curr_stat(ch, STAT_CON) + get_curr_stat(ch, STAT_DEX)) / 3);
	add_prac = wis_app[get_curr_stat(ch, STAT_WIS)].practice;

	tmp = -1.3333 + .5333 * get_curr_stat(ch, STAT_CON) + 1.3333 * ch->Class()->gainconst + number_range(-1, 2);
	add_hp = (int)tmp;

	if (get_curr_stat(ch, STAT_CON) >= 24)
		add_hp += get_curr_stat(ch, STAT_CON) - 23;

	tmp = 8.0278 + 0.5667 * get_curr_stat(ch, STAT_INT) - 2.0833 * ch->Class()->gainconst + number_range(-1, 2);
	add_mana = (int)tmp;

	if (ch->Class()->GetIndex() == CLASS_WARRIOR && number_percent() > 75)
		add_hp += 1;

	if (ch->Class()->GetIndex() == CLASS_NECROMANCER)
		add_mana -= number_range(2, 5);

	if (ch->Class()->GetIndex() == CLASS_SORCERER)
		add_mana -= number_range(1, 2);

	add_move = std::max(6, add_move);

	ch->max_hit += add_hp;
	ch->max_mana += add_mana;
	ch->max_move += add_move;
	ch->practice += add_prac;

	if (ch->level % 5 == 0)
		ch->train += 1;

	if (ch->Class()->GetIndex() == CLASS_WARRIOR && ch->level % 20 == 0)
		ch->pcdata->special++;

	ch->pcdata->perm_hit += add_hp;
	ch->pcdata->perm_mana += add_mana;
	ch->pcdata->perm_move += add_move;

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (ch->pcdata->learned[sn] > 10 && skill_table[sn].ctype != CMD_POWER)
		{
			ch->pcdata->learned[sn]++;
			ch->pcdata->learned[sn] = std::min((int)ch->pcdata->learned[sn], 100);
		}
	}

	for (i = 0; i < 100; i++)
	{
		if (ch->pcdata->recentkills[i]
			&& ch->pcdata->recentkills[i][0] != '\0'
			&& strcmp(ch->pcdata->recentkills[i], ""))
		{
			free_pstring(ch->pcdata->recentkills[i]);
			ch->pcdata->recentkills[i] = nullptr;
		}
	}

	if (!hide)
	{
		sprintf(buf, "%sYou gain %d/%d hp, %d/%d mana, %d/%d move, and %d/%d practices.%s\n\r",
			get_char_color(ch, "lightgreen"),
			add_hp,
			ch->max_hit,
			add_mana,
			ch->max_mana,
			add_move,
			ch->max_move,
			add_prac,
			ch->practice,
			END_COLOR(ch));
		send_to_char(buf, ch);
	}

	save_char_obj(ch);
}